

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
           *this,size_t i,piecewise_construct_t *args,tuple<const_char_&> *args_1,
          tuple<const_char_&> *args_2)

{
  allocator<std::pair<const_char,_char>_> *in_RCX;
  piecewise_construct_t *in_RDI;
  slot_type *in_R8;
  tuple<const_char_&> *in_stack_ffffffffffffffc8;
  
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  ::alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
               *)0x161b4c);
  hash_policy_traits<phmap::priv::FlatHashMapPolicy<char,char>,void>::
  construct<std::allocator<std::pair<char_const,char>>,std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
            (in_RCX,in_R8,in_RDI,in_stack_ffffffffffffffc8,(tuple<const_char_&> *)0x161b77);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}